

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O0

void __thiscall Frame::findAttributes(Frame *this)

{
  cp_info *pcVar1;
  char *str;
  u1 *puVar2;
  Code_attribute *pCVar3;
  bool bVar4;
  cp_info **ppcVar5;
  attribute_info *paVar6;
  int iVar7;
  char *str_00;
  CONSTANT_Utf8_info constant;
  CONSTANT_Utf8_info constant_00;
  CONSTANT_Utf8_info attrName;
  attribute_info *attr;
  int i;
  cp_info *constantPool;
  Frame *this_local;
  
  ppcVar5 = getConstantPool(this);
  pcVar1 = *ppcVar5;
  this->_codeAttribute = (Code_attribute *)0x0;
  this->_exceptionsAttribute = (Exceptions_attribute *)0x0;
  attr._4_4_ = 0;
  do {
    if ((int)(uint)(this->_method).attributes_count <= attr._4_4_) {
      return;
    }
    paVar6 = (this->_method).attributes + attr._4_4_;
    iVar7 = paVar6->attribute_name_index - 1;
    str = *(char **)&pcVar1[iVar7].info;
    puVar2 = pcVar1[iVar7].info.utf8_info.bytes;
    constant.bytes = (u1 *)"Code";
    constant._0_8_ = puVar2;
    str_00 = str;
    bVar4 = Utils::compareUtf8WithString((Utils *)((ulong)str & 0xffff),constant,str);
    if (bVar4) {
      this->_codeAttribute = (Code_attribute *)&paVar6->info;
      pCVar3 = (Code_attribute *)this->_exceptionsAttribute;
joined_r0x0012b342:
      if (pCVar3 != (Code_attribute *)0x0) {
        return;
      }
    }
    else {
      constant_00.bytes = (u1 *)"Exceptions";
      constant_00._0_8_ = puVar2;
      bVar4 = Utils::compareUtf8WithString((Utils *)((ulong)str & 0xffff),constant_00,str_00);
      if (bVar4) {
        this->_exceptionsAttribute = (Exceptions_attribute *)&paVar6->info;
        pCVar3 = this->_codeAttribute;
        goto joined_r0x0012b342;
      }
    }
    attr._4_4_ = attr._4_4_ + 1;
  } while( true );
}

Assistant:

void Frame::findAttributes() {
    cp_info *constantPool = *getConstantPool();
    
    _codeAttribute = NULL;
    _exceptionsAttribute = NULL;
    
    for (int i = 0; i < _method.attributes_count; i++) {
        attribute_info *attr = &(_method.attributes[i]);
        CONSTANT_Utf8_info attrName = constantPool[attr->attribute_name_index-1].info.utf8_info;
        
        if (Utils::compareUtf8WithString(attrName, "Code")) {
            _codeAttribute = &(attr->info.code_info);
            if (_exceptionsAttribute != NULL) break;
        } else if (Utils::compareUtf8WithString(attrName, "Exceptions")) {
            _exceptionsAttribute = &(attr->info.exceptions_info);
            if (_codeAttribute != NULL) break;
        }
    }
}